

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos_blocker.cpp
# Opt level: O3

bool __thiscall
libtorrent::dht::dos_blocker::incoming
          (dos_blocker *this,address *addr,time_point now,dht_logger *logger)

{
  anon_enum_32 aVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  address *addr_00;
  node_ban_entry *pnVar5;
  address_v6 *paVar6;
  ulong uVar7;
  node_ban_entry *pnVar8;
  node_ban_entry *pnVar9;
  undefined1 auVar10 [16];
  string local_50;
  
  pnVar5 = this->m_ban_nodes;
  aVar1 = addr->type_;
  paVar6 = &this->m_ban_nodes[0].src.ipv6_address_;
  uVar7 = 0xffffffffffffffd8;
  pnVar8 = pnVar5;
  do {
    if ((pnVar5->src).type_ == aVar1) {
      if (aVar1 == ipv6) {
        auVar10[0] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[0]);
        auVar10[1] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[1] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[1]);
        auVar10[2] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[2] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[2]);
        auVar10[3] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[3] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[3]);
        auVar10[4] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[4] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[4]);
        auVar10[5] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[5] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[5]);
        auVar10[6] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[6] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[6]);
        auVar10[7] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[7] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[7]);
        auVar10[8] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[8] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[8]);
        auVar10[9] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[9] ==
                      (paVar6->addr_).__in6_u.__u6_addr8[9]);
        auVar10[10] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[10] ==
                       (paVar6->addr_).__in6_u.__u6_addr8[10]);
        auVar10[0xb] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] ==
                        (paVar6->addr_).__in6_u.__u6_addr8[0xb]);
        auVar10[0xc] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] ==
                        (paVar6->addr_).__in6_u.__u6_addr8[0xc]);
        auVar10[0xd] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] ==
                        (paVar6->addr_).__in6_u.__u6_addr8[0xd]);
        auVar10[0xe] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] ==
                        (paVar6->addr_).__in6_u.__u6_addr8[0xe]);
        auVar10[0xf] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] ==
                        (paVar6->addr_).__in6_u.__u6_addr8[0xf]);
        if (((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff) &&
           ((pnVar5->src).ipv6_address_.scope_id_ == (addr->ipv6_address_).scope_id_)) {
LAB_0034a068:
          iVar4 = pnVar5->count + 1;
          pnVar5->count = iVar4;
          iVar3 = this->m_message_rate_limit * 10;
          if (SBORROW4(iVar4,iVar3) != iVar4 + this->m_message_rate_limit * -10 < 0) {
            return true;
          }
          if ((long)now.__d.__r < (pnVar5->limit).__d.__r) {
            if (iVar4 == iVar3) {
              if ((logger != (dht_logger *)0x0) &&
                 (iVar3 = (**logger->_vptr_dht_logger)(logger,0), (char)iVar3 != '\0')) {
                print_address_abi_cxx11_(&local_50,(libtorrent *)addr,addr_00);
                auVar10 = SEXT816(((long)now.__d.__r + 10000000000) - (pnVar5->limit).__d.__r) *
                          SEXT816(0x431bde82d7b634db);
                (*logger->_vptr_dht_logger[1])
                          (logger,0,"BANNING PEER [ ip: %s time: %d ms count: %d ]",
                           local_50._M_dataplus._M_p,
                           (ulong)(uint)((int)(auVar10._8_8_ >> 0x12) - (auVar10._12_4_ >> 0x1f)),
                           (ulong)(uint)pnVar5->count);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              (pnVar5->limit).__d.__r = (long)this->m_block_timeout * 1000000000 + (long)now.__d.__r
              ;
            }
            return false;
          }
          pnVar5->count = 0;
          (pnVar5->limit).__d.__r = (long)now.__d.__r + 10000000000;
          return true;
        }
      }
      else if ((pnVar5->src).ipv4_address_.addr_.s_addr == (addr->ipv4_address_).addr_.s_addr)
      goto LAB_0034a068;
    }
    pnVar9 = pnVar5;
    if ((pnVar8->count <= pnVar5->count) &&
       ((pnVar5->count != pnVar8->count || ((pnVar8->limit).__d.__r <= (pnVar5->limit).__d.__r)))) {
      pnVar9 = pnVar8;
    }
    pnVar5 = pnVar5 + 1;
    paVar6 = paVar6 + 2;
    uVar7 = uVar7 + 0x30;
    pnVar8 = pnVar9;
    if (0x397 < uVar7) {
      pnVar9->count = 1;
      (pnVar9->limit).__d.__r = (long)now.__d.__r + 10000000000;
      (pnVar9->src).type_ = aVar1;
      (pnVar9->src).ipv4_address_.addr_.s_addr = (addr->ipv4_address_).addr_.s_addr;
      uVar2 = *(undefined8 *)((long)&(addr->ipv6_address_).addr_.__in6_u + 8);
      *(undefined8 *)&(pnVar9->src).ipv6_address_.addr_.__in6_u =
           *(undefined8 *)&(addr->ipv6_address_).addr_.__in6_u;
      *(undefined8 *)((long)&(pnVar9->src).ipv6_address_.addr_.__in6_u + 8) = uVar2;
      (pnVar9->src).ipv6_address_.scope_id_ = (addr->ipv6_address_).scope_id_;
      return true;
    }
  } while( true );
}

Assistant:

bool dos_blocker::incoming(address const& addr, time_point const now, dht_logger* logger)
	{
		TORRENT_UNUSED(logger);
		node_ban_entry* match = nullptr;
		node_ban_entry* min = m_ban_nodes;
		for (node_ban_entry* i = m_ban_nodes; i < m_ban_nodes + num_ban_nodes; ++i)
		{
			if (i->src == addr)
			{
				match = i;
				break;
			}
			if (i->count < min->count) min = i;
			else if (i->count == min->count
				&& i->limit < min->limit) min = i;
		}

		if (match)
		{
			++match->count;

			if (match->count >= m_message_rate_limit * 10)
			{
				if (now < match->limit)
				{
					if (match->count == m_message_rate_limit * 10)
					{
#ifndef TORRENT_DISABLE_LOGGING
						if (logger != nullptr && logger->should_log(dht_logger::tracker))
						{
							logger->log(dht_logger::tracker, "BANNING PEER [ ip: %s time: %d ms count: %d ]"
								, print_address(addr).c_str()
								, int(total_milliseconds((now - match->limit) + seconds(10)))
								, match->count);
						}
#else
						TORRENT_UNUSED(logger);
#endif // TORRENT_DISABLE_LOGGING
						// we've received too many messages in less than 10 seconds
						// from this node. Ignore it until it's silent for 5 minutes
						match->limit = now + seconds(m_block_timeout);
					}

					return false;
				}

				// the messages we received from this peer took more than 10
				// seconds. Reset the counter and the timer
				match->count = 0;
				match->limit = now + seconds(10);
			}
		}
		else
		{
			min->count = 1;
			min->limit = now + seconds(10);
			min->src = addr;
		}
		return true;
	}